

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O1

void pre_process_data(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                     JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr,
                     JDIMENSION out_row_groups_avail)

{
  int iVar1;
  jpeg_c_prep_controller *pjVar2;
  JDIMENSION JVar3;
  jpeg_c_prep_controller *pjVar4;
  JSAMPARRAY ppJVar5;
  uint uVar6;
  int iVar7;
  jpeg_component_info *pjVar8;
  uint uVar9;
  int row;
  int iVar10;
  int row_1;
  long lVar11;
  long local_70;
  
  uVar6 = *in_row_ctr;
  if (uVar6 < in_rows_avail) {
    pjVar4 = cinfo->prep;
    do {
      if (out_row_groups_avail <= *out_row_group_ctr) {
        return;
      }
      JVar3 = *(JDIMENSION *)((long)&pjVar4[6].start_pass + 4);
      uVar9 = cinfo->max_v_samp_factor - JVar3;
      if (in_rows_avail - uVar6 <= uVar9) {
        uVar9 = in_rows_avail - uVar6;
      }
      (*cinfo->cconvert->color_convert)
                (cinfo,input_buf + uVar6,(JSAMPIMAGE)(pjVar4 + 1),JVar3,uVar9);
      *in_row_ctr = *in_row_ctr + uVar9;
      iVar7 = *(int *)((long)&pjVar4[6].start_pass + 4) + uVar9;
      *(int *)((long)&pjVar4[6].start_pass + 4) = iVar7;
      pjVar2 = pjVar4 + 6;
      *(uint *)&pjVar2->start_pass = *(int *)&pjVar2->start_pass - uVar9;
      if ((*(int *)&pjVar2->start_pass == 0) && (iVar7 < cinfo->max_v_samp_factor)) {
        if (0 < cinfo->num_components) {
          lVar11 = 0;
          do {
            iVar7 = cinfo->max_v_samp_factor;
            iVar10 = *(int *)((long)&pjVar4[6].start_pass + 4);
            if (iVar10 < iVar7) {
              ppJVar5 = (JSAMPARRAY)(&pjVar4[1].start_pass)[lVar11];
              JVar3 = cinfo->image_width;
              iVar1 = iVar10 + -1;
              do {
                jcopy_sample_rows(ppJVar5,iVar1,ppJVar5,iVar10,1,JVar3);
                iVar10 = iVar10 + 1;
              } while (iVar7 != iVar10);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < cinfo->num_components);
        }
        *(int *)((long)&pjVar4[6].start_pass + 4) = cinfo->max_v_samp_factor;
      }
      if (*(int *)((long)&pjVar4[6].start_pass + 4) == cinfo->max_v_samp_factor) {
        (*cinfo->downsample->downsample)
                  (cinfo,(JSAMPIMAGE)(pjVar4 + 1),0,output_buf,*out_row_group_ctr);
        *(undefined4 *)((long)&pjVar4[6].start_pass + 4) = 0;
        *out_row_group_ctr = *out_row_group_ctr + 1;
      }
      if ((*(int *)&pjVar4[6].start_pass == 0) && (*out_row_group_ctr < out_row_groups_avail)) {
        if (0 < cinfo->num_components) {
          pjVar8 = cinfo->comp_info;
          local_70 = 0;
          do {
            iVar7 = pjVar8->v_samp_factor;
            iVar10 = iVar7 * *out_row_group_ctr;
            if (iVar10 < (int)(iVar7 * out_row_groups_avail)) {
              ppJVar5 = output_buf[local_70];
              JVar3 = pjVar8->width_in_blocks;
              iVar1 = iVar10 + -1;
              iVar7 = iVar7 * (out_row_groups_avail - *out_row_group_ctr);
              do {
                jcopy_sample_rows(ppJVar5,iVar1,ppJVar5,iVar10,1,JVar3 << 3);
                iVar10 = iVar10 + 1;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            local_70 = local_70 + 1;
            pjVar8 = pjVar8 + 1;
          } while (local_70 < cinfo->num_components);
        }
        *out_row_group_ctr = out_row_groups_avail;
        return;
      }
      uVar6 = *in_row_ctr;
    } while (uVar6 < in_rows_avail);
  }
  return;
}

Assistant:

METHODDEF(void)
pre_process_data(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                 JDIMENSION *in_row_ctr, JDIMENSION in_rows_avail,
                 JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
                 JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr)cinfo->prep;
  int numrows, ci;
  JDIMENSION inrows;
  jpeg_component_info *compptr;

  while (*in_row_ctr < in_rows_avail &&
         *out_row_group_ctr < out_row_groups_avail) {
    /* Do color conversion to fill the conversion buffer. */
    inrows = in_rows_avail - *in_row_ctr;
    numrows = cinfo->max_v_samp_factor - prep->next_buf_row;
    numrows = (int)MIN((JDIMENSION)numrows, inrows);
    (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
                                       prep->color_buf,
                                       (JDIMENSION)prep->next_buf_row,
                                       numrows);
    *in_row_ctr += numrows;
    prep->next_buf_row += numrows;
    prep->rows_to_go -= numrows;
    /* If at bottom of image, pad to fill the conversion buffer. */
    if (prep->rows_to_go == 0 &&
        prep->next_buf_row < cinfo->max_v_samp_factor) {
      for (ci = 0; ci < cinfo->num_components; ci++) {
        expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
                           prep->next_buf_row, cinfo->max_v_samp_factor);
      }
      prep->next_buf_row = cinfo->max_v_samp_factor;
    }
    /* If we've filled the conversion buffer, empty it. */
    if (prep->next_buf_row == cinfo->max_v_samp_factor) {
      (*cinfo->downsample->downsample) (cinfo,
                                        prep->color_buf, (JDIMENSION)0,
                                        output_buf, *out_row_group_ctr);
      prep->next_buf_row = 0;
      (*out_row_group_ctr)++;
    }
    /* If at bottom of image, pad the output to a full iMCU height.
     * Note we assume the caller is providing a one-iMCU-height output buffer!
     */
    if (prep->rows_to_go == 0 && *out_row_group_ctr < out_row_groups_avail) {
      for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
           ci++, compptr++) {
        expand_bottom_edge(output_buf[ci], compptr->width_in_blocks * DCTSIZE,
                           (int)(*out_row_group_ctr * compptr->v_samp_factor),
                           (int)(out_row_groups_avail * compptr->v_samp_factor));
      }
      *out_row_group_ctr = out_row_groups_avail;
      break;                    /* can exit outer loop without test */
    }
  }
}